

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::LossLayer::~LossLayer(LossLayer *this)

{
  ~LossLayer(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

LossLayer::~LossLayer() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.LossLayer)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}